

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

float HalfToFloat(unsigned_short x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  
  uVar5 = (uint)CONCAT62(in_register_0000003a,x);
  uVar4 = uVar5 << 0xd;
  uVar3 = uVar4 & 0x7fe000;
  uVar2 = (uint)(CONCAT62(in_register_0000003a,x) >> 10) & 0x1f;
  uVar4 = ((uint)(float)uVar3 & 0x7f800000) + 0xed800000 +
          (uVar4 << (0x96U - (char)((uint)(float)uVar3 >> 0x17) & 0x1f) & 0x7fe000);
  if (uVar3 == 0) {
    uVar4 = 0;
  }
  uVar1 = 0;
  uVar3 = uVar2 * 0x800000 + 0x38000000 + uVar3;
  if ((x & 0x7c00) == 0) {
    uVar1 = uVar4;
    uVar3 = uVar2;
  }
  return (float)(uVar3 | (uVar5 & 0x8000) << 0x10 | uVar1);
}

Assistant:

static float HalfToFloat(unsigned short x)
{
    float result = 0.0f;

    const unsigned int e = (x & 0x7C00) >> 10; // Exponent
    const unsigned int m = (x & 0x03FF) << 13; // Mantissa
    const float fm = (float)m;
    const unsigned int v = (*(unsigned int*)&fm) >> 23; // Evil log2 bit hack to count leading zeros in denormalized format
    const unsigned int r = (x & 0x8000) << 16 | (e != 0)*((e + 112) << 23 | m) | ((e == 0)&(m != 0))*((v - 37) << 23 | ((m << (150 - v)) & 0x007FE000)); // sign : normalized : denormalized

    result = *(float *)&r;

    return result;
}